

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsStats::SubmitKeyRecord(DnsStats *this,uint8_t *content,uint32_t length)

{
  byte bVar1;
  ushort uVar2;
  bool stored;
  DnsHashEntry key;
  bool local_89;
  DnsHashEntry local_88;
  
  if (8 < length) {
    bVar1 = content[3];
    local_88.HashNext = (DnsHashEntry *)0x0;
    local_89 = false;
    local_88.count = 1;
    local_88.hash = 0;
    local_88.registry_id = 0xd;
    local_88.key_type = 0;
    local_88.key_length = 4;
    local_88.field_6.key_number = (uint)bVar1;
    BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_88,true,&local_89);
    if ((bVar1 == 2) &&
       (uVar2 = *(ushort *)(content + 4) << 8 | *(ushort *)(content + 4) >> 8, uVar2 < 0x10)) {
      local_88.HashNext = (DnsHashEntry *)0x0;
      local_89 = false;
      local_88.count = 1;
      local_88.hash = 0;
      local_88.registry_id = 0xe;
      local_88.key_type = 0;
      local_88.key_length = 4;
      local_88.field_6.key_number = (uint)uVar2;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_88,true,&local_89);
      if (uVar2 - 1 < 2) {
        local_88.HashNext = (DnsHashEntry *)0x0;
        local_89 = false;
        local_88.count = 1;
        local_88.hash = 0;
        local_88.registry_id = 0x11;
        local_88.key_type = 0;
        local_88.key_length = 4;
        local_88.field_6.key_number =
             (uint32_t)(ushort)(*(ushort *)(content + 6) << 8 | *(ushort *)(content + 6) >> 8);
        BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_88,true,&local_89);
      }
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitKeyRecord(uint8_t * content, uint32_t length)
{
    if (length > 8)
    {
        uint32_t algorithm = content[3];
        SubmitRegistryNumber(REGISTRY_DNSSEC_Algorithm_Numbers, algorithm);

        if (algorithm == 2)
        {
            uint32_t prime_length = (content[4] << 8) | content[5];
            if (prime_length < 16)
            {
                SubmitRegistryNumber(REGISTRY_DNSSEC_KEY_Prime_Lengths, prime_length);

                if (prime_length == 1 || prime_length == 2)
                {
                    uint32_t well_known_prime = (content[6] << 8) | content[7];
                    SubmitRegistryNumber(REGISTRY_DNSSEC_KEY_Well_Known_Primes, well_known_prime);
                }
            }
        }
    }
}